

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

QPainterPath __thiscall QPainterPath::united(QPainterPath *this,QPainterPath *p)

{
  bool bVar1;
  QPainterPath *in_RDX;
  long in_FS_OFFSET;
  undefined1 local_58 [24];
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isEmpty(p);
  if ((bVar1) || (bVar1 = isEmpty(in_RDX), bVar1)) {
    bVar1 = isEmpty(p);
    if (!bVar1) {
      in_RDX = p;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QPainterPath(this,in_RDX);
      return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
    }
  }
  else {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPathClipper::QPathClipper((QPathClipper *)local_58,p,in_RDX);
    QPathClipper::clip((QPathClipper *)this,(Operation)local_58);
    ~QPainterPath((QPainterPath *)(local_58 + 8));
    ~QPainterPath((QPainterPath *)local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QPainterPath::united(const QPainterPath &p) const
{
    if (isEmpty() || p.isEmpty())
        return isEmpty() ? p : *this;
    QPathClipper clipper(*this, p);
    return clipper.clip(QPathClipper::BoolOr);
}